

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# lgc.c
# Opt level: O0

GCObject **
sweepgen(lua_State *L,global_State *g,GCObject **p,GCObject *limit,GCObject **pfirstold1,
        l_mem *paddedold)

{
  byte bVar1;
  GCObject *o;
  l_mem lVar2;
  int marked;
  int age;
  GCObject *curr;
  long lStack_40;
  int white;
  l_mem addedold;
  l_mem *paddedold_local;
  GCObject **pfirstold1_local;
  GCObject *limit_local;
  GCObject **p_local;
  global_State *g_local;
  lua_State *L_local;
  
  lStack_40 = 0;
  bVar1 = g->currentwhite;
  limit_local = (GCObject *)p;
  while (o = limit_local->next, o != limit) {
    if ((o->marked & 0x18) == 0) {
      limit_local = o;
      if ((o->marked & 7) == 0) {
        o->marked = o->marked & 0xc0 | 1 | bVar1 & 0x18;
      }
      else {
        o->marked = o->marked & 0xf8 | "\x01\x03\x03\x04\x04\x05\x06"[(int)(o->marked & 7)];
        if ((o->marked & 7) == 3) {
          lVar2 = objsize(o);
          lStack_40 = lVar2 + lStack_40;
          if (*pfirstold1 == (GCObject *)0x0) {
            *pfirstold1 = o;
          }
        }
      }
    }
    else {
      limit_local->next = o->next;
      freeobj(L,o);
    }
  }
  *paddedold = lStack_40 + *paddedold;
  return &limit_local->next;
}

Assistant:

static GCObject **sweepgen (lua_State *L, global_State *g, GCObject **p,
                            GCObject *limit, GCObject **pfirstold1,
                            l_mem *paddedold) {
  static const lu_byte nextage[] = {
    G_SURVIVAL,  /* from G_NEW */
    G_OLD1,      /* from G_SURVIVAL */
    G_OLD1,      /* from G_OLD0 */
    G_OLD,       /* from G_OLD1 */
    G_OLD,       /* from G_OLD (do not change) */
    G_TOUCHED1,  /* from G_TOUCHED1 (do not change) */
    G_TOUCHED2   /* from G_TOUCHED2 (do not change) */
  };
  l_mem addedold = 0;
  int white = luaC_white(g);
  GCObject *curr;
  while ((curr = *p) != limit) {
    if (iswhite(curr)) {  /* is 'curr' dead? */
      lua_assert(!isold(curr) && isdead(g, curr));
      *p = curr->next;  /* remove 'curr' from list */
      freeobj(L, curr);  /* erase 'curr' */
    }
    else {  /* correct mark and age */
      int age = getage(curr);
      if (age == G_NEW) {  /* new objects go back to white */
        int marked = curr->marked & ~maskgcbits;  /* erase GC bits */
        curr->marked = cast_byte(marked | G_SURVIVAL | white);
      }
      else {  /* all other objects will be old, and so keep their color */
        lua_assert(age != G_OLD1);  /* advanced in 'markold' */
        setage(curr, nextage[age]);
        if (getage(curr) == G_OLD1) {
          addedold += objsize(curr);  /* bytes becoming old */
          if (*pfirstold1 == NULL)
            *pfirstold1 = curr;  /* first OLD1 object in the list */
        }
      }
      p = &curr->next;  /* go to next element */
    }
  }
  *paddedold += addedold;
  return p;
}